

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_copy_to_file.cpp
# Opt level: O1

vector<duckdb::LogicalType,_true> *
duckdb::LogicalCopyToFile::GetTypesWithoutPartitions
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,
          vector<duckdb::LogicalType,_true> *col_types,vector<unsigned_long,_true> *part_cols,
          bool write_part_cols)

{
  _Rb_tree_header *p_Var1;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  const_reference __x;
  undefined7 in_register_00000009;
  _Rb_tree_header *p_Var4;
  ulong __n;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> part_col_set;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  _Stack_58;
  
  if ((int)CONCAT71(in_register_00000009,write_part_cols) == 0) {
    __first._M_current =
         (part_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (part_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      (__return_storage_ptr__->
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
      set<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)
                 &_Stack_58,__first,__last);
      if ((col_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (col_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        p_Var1 = &_Stack_58._M_impl.super__Rb_tree_header;
        __n = 0;
        p_Var3 = &p_Var1->_M_header;
        p_Var2 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
              p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < __n]) {
            if (*(ulong *)(p_Var2 + 1) >= __n) {
              p_Var3 = p_Var2;
            }
          }
          p_Var4 = p_Var1;
          if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
             (p_Var4 = (_Rb_tree_header *)p_Var3, __n < ((_Rb_tree_header *)p_Var3)->_M_node_count))
          {
            p_Var4 = p_Var1;
          }
          if (p_Var4 == p_Var1) {
            __x = vector<duckdb::LogicalType,_true>::operator[](col_types,__n);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                      (&__return_storage_ptr__->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x)
            ;
          }
          __n = __n + 1;
          p_Var3 = &p_Var1->_M_header;
          p_Var2 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent;
        } while (__n < (ulong)(((long)(col_types->
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ).
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(col_types->
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ).
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
      }
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&_Stack_58);
      return __return_storage_ptr__;
    }
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&__return_storage_ptr__->
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &col_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return __return_storage_ptr__;
}

Assistant:

vector<LogicalType> LogicalCopyToFile::GetTypesWithoutPartitions(const vector<LogicalType> &col_types,
                                                                 const vector<idx_t> &part_cols, bool write_part_cols) {
	if (write_part_cols || part_cols.empty()) {
		return col_types;
	}
	vector<LogicalType> types;
	set<idx_t> part_col_set(part_cols.begin(), part_cols.end());
	for (idx_t col_idx = 0; col_idx < col_types.size(); col_idx++) {
		if (part_col_set.find(col_idx) == part_col_set.end()) {
			types.push_back(col_types[col_idx]);
		}
	}
	return types;
}